

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::QSystemTrayIconPrivate(QSystemTrayIconPrivate *this)

{
  QPlatformSystemTrayIcon *pQVar1;
  
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QSystemTrayIconPrivate_007f0670;
  (this->menu).wp.d = (Data *)0x0;
  (this->menu).wp.value = (QObject *)0x0;
  QIcon::QIcon(&this->icon);
  (this->toolTip).d.size = 0;
  this->sys = (QSystemTrayIconSys *)0x0;
  (this->toolTip).d.d = (Data *)0x0;
  (this->toolTip).d.ptr = (char16_t *)0x0;
  pQVar1 = (QPlatformSystemTrayIcon *)
           (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x40))();
  this->qpa_sys = pQVar1;
  this->visible = false;
  this->trayWatcher = (QSystemTrayWatcher *)0x0;
  return;
}

Assistant:

QSystemTrayIconPrivate::QSystemTrayIconPrivate()
    : sys(nullptr),
      qpa_sys(QGuiApplicationPrivate::platformTheme()->createPlatformSystemTrayIcon()),
      visible(false),
      trayWatcher(nullptr)
{
}